

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InternalException::InternalException<long,unsigned_long,unsigned_int>
          (InternalException *this,string *msg,long params,unsigned_long params_1,uint params_2)

{
  undefined4 in_register_00000084;
  uint in_R9D;
  string local_30;
  
  Exception::ConstructMessage<long,unsigned_long,unsigned_int>
            (&local_30,(Exception *)msg,(string *)params,params_1,
             CONCAT44(in_register_00000084,params_2),in_R9D);
  InternalException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}